

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall VmaBlockMetadata_TLSF::Validate(VmaBlockMetadata_TLSF *this)

{
  VmaBlockBufferImageGranularity *this_00;
  Block *pBVar1;
  VkDeviceSize offset;
  VkDeviceSize size;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  anon_union_8_2_34c73d97_for_Block_5 *paVar4;
  Block *pBVar5;
  undefined4 extraout_var_00;
  VkDeviceSize VVar6;
  ulong uVar7;
  Block *pBVar8;
  VkDeviceSize VVar9;
  bool bVar10;
  ValidationContext validateCtx;
  size_t local_58;
  VkDeviceSize local_50;
  size_t local_48;
  ValidationContext local_40;
  
  iVar2 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[6])();
  if (CONCAT44(extraout_var,iVar2) <= (this->super_VmaBlockMetadata).m_Size) {
    VVar6 = this->m_NullBlock->size;
    for (uVar7 = 0; uVar7 != this->m_ListsCount; uVar7 = uVar7 + 1) {
      pBVar8 = this->m_FreeList[uVar7];
      if (pBVar8 != (Block *)0x0) {
        if (pBVar8->prevFree != (Block *)0x0) {
          return false;
        }
        while (pBVar1 = (pBVar8->field_5).nextFree, pBVar1 != (Block *)0x0) {
          if (pBVar1->prevFree == pBVar1) {
            return false;
          }
          bVar10 = pBVar1->prevFree != pBVar8;
          pBVar8 = pBVar1;
          if (bVar10) {
            return false;
          }
        }
      }
    }
    VVar9 = this->m_NullBlock->offset;
    this_00 = &this->m_GranularityHandler;
    local_40 = VmaBlockBufferImageGranularity::StartValidation
                         (this_00,(this->super_VmaBlockMetadata).m_pAllocationCallbacks,
                          (this->super_VmaBlockMetadata).m_IsVirtual);
    pBVar8 = this->m_NullBlock;
    if ((pBVar8->nextPhysical == (Block *)0x0) &&
       ((pBVar1 = pBVar8->prevPhysical, pBVar1 == (Block *)0x0 || (pBVar1->nextPhysical == pBVar8)))
       ) {
      local_58 = 0;
      local_48 = 0;
      local_50 = VVar6;
      while (pBVar8 = pBVar1, pBVar8 != (Block *)0x0) {
        offset = pBVar8->offset;
        size = pBVar8->size;
        if (offset + size != VVar9) {
          return false;
        }
        uVar3 = GetListIndex(this,size);
        paVar4 = (anon_union_8_2_34c73d97_for_Block_5 *)
                 ((ulong)(uVar3 << 3) + (long)this->m_FreeList);
        if (pBVar8->prevFree == pBVar8) {
          local_58 = local_58 + 1;
          while (pBVar1 = paVar4->nextFree, pBVar1 != (Block *)0x0) {
            paVar4 = &pBVar1->field_5;
            if (pBVar1 == pBVar8) {
              return false;
            }
          }
          if (((this->super_VmaBlockMetadata).m_IsVirtual == false) &&
             (bVar10 = VmaBlockBufferImageGranularity::Validate(this_00,&local_40,offset,size),
             !bVar10)) {
            return false;
          }
        }
        else {
          if (paVar4->nextFree == (Block *)0x0) {
            return false;
          }
          local_48 = local_48 + 1;
          pBVar1 = paVar4->nextFree;
          do {
            pBVar5 = pBVar1;
            if (pBVar5 == pBVar8) break;
            pBVar1 = (pBVar5->field_5).nextFree;
          } while ((pBVar5->field_5).nextFree != (Block *)0x0);
          if (pBVar5 != pBVar8) {
            return false;
          }
          local_50 = local_50 + size;
        }
        VVar6 = VVar6 + size;
        pBVar1 = pBVar8->prevPhysical;
        VVar9 = offset;
        if ((pBVar1 != (Block *)0x0) && (pBVar1->nextPhysical != pBVar8)) {
          return false;
        }
      }
      if ((this->super_VmaBlockMetadata).m_IsVirtual == false) {
        bVar10 = VmaBlockBufferImageGranularity::FinishValidation(this_00,&local_40);
        if (!bVar10) {
          return false;
        }
        if (VVar9 != 0) {
          return false;
        }
      }
      else if (VVar9 != 0) {
        return false;
      }
      if (VVar6 == (this->super_VmaBlockMetadata).m_Size) {
        iVar2 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[6])(this);
        if (local_50 != CONCAT44(extraout_var_00,iVar2)) {
          return false;
        }
        if (local_58 == this->m_AllocCount) {
          return local_48 == this->m_BlocksFreeCount;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool VmaBlockMetadata_TLSF::Validate() const
{
    VMA_VALIDATE(GetSumFreeSize() <= GetSize());

    VkDeviceSize calculatedSize = m_NullBlock->size;
    VkDeviceSize calculatedFreeSize = m_NullBlock->size;
    size_t allocCount = 0;
    size_t freeCount = 0;

    // Check integrity of free lists
    for (uint32_t list = 0; list < m_ListsCount; ++list)
    {
        Block* block = m_FreeList[list];
        if (block != VMA_NULL)
        {
            VMA_VALIDATE(block->IsFree());
            VMA_VALIDATE(block->PrevFree() == VMA_NULL);
            while (block->NextFree())
            {
                VMA_VALIDATE(block->NextFree()->IsFree());
                VMA_VALIDATE(block->NextFree()->PrevFree() == block);
                block = block->NextFree();
            }
        }
    }

    VkDeviceSize nextOffset = m_NullBlock->offset;
    auto validateCtx = m_GranularityHandler.StartValidation(GetAllocationCallbacks(), IsVirtual());

    VMA_VALIDATE(m_NullBlock->nextPhysical == VMA_NULL);
    if (m_NullBlock->prevPhysical)
    {
        VMA_VALIDATE(m_NullBlock->prevPhysical->nextPhysical == m_NullBlock);
    }
    // Check all blocks
    for (Block* prev = m_NullBlock->prevPhysical; prev != VMA_NULL; prev = prev->prevPhysical)
    {
        VMA_VALIDATE(prev->offset + prev->size == nextOffset);
        nextOffset = prev->offset;
        calculatedSize += prev->size;

        uint32_t listIndex = GetListIndex(prev->size);
        if (prev->IsFree())
        {
            ++freeCount;
            // Check if free block belongs to free list
            Block* freeBlock = m_FreeList[listIndex];
            VMA_VALIDATE(freeBlock != VMA_NULL);

            bool found = false;
            do
            {
                if (freeBlock == prev)
                    found = true;

                freeBlock = freeBlock->NextFree();
            } while (!found && freeBlock != VMA_NULL);

            VMA_VALIDATE(found);
            calculatedFreeSize += prev->size;
        }
        else
        {
            ++allocCount;
            // Check if taken block is not on a free list
            Block* freeBlock = m_FreeList[listIndex];
            while (freeBlock)
            {
                VMA_VALIDATE(freeBlock != prev);
                freeBlock = freeBlock->NextFree();
            }

            if (!IsVirtual())
            {
                VMA_VALIDATE(m_GranularityHandler.Validate(validateCtx, prev->offset, prev->size));
            }
        }

        if (prev->prevPhysical)
        {
            VMA_VALIDATE(prev->prevPhysical->nextPhysical == prev);
        }
    }

    if (!IsVirtual())
    {
        VMA_VALIDATE(m_GranularityHandler.FinishValidation(validateCtx));
    }

    VMA_VALIDATE(nextOffset == 0);
    VMA_VALIDATE(calculatedSize == GetSize());
    VMA_VALIDATE(calculatedFreeSize == GetSumFreeSize());
    VMA_VALIDATE(allocCount == m_AllocCount);
    VMA_VALIDATE(freeCount == m_BlocksFreeCount);

    return true;
}